

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void do_cmd_buy_stat(command_conflict *cmd)

{
  wchar_t local_14;
  command_conflict *pcStack_10;
  wchar_t choice;
  command_conflict *cmd_local;
  
  if (!rolled_stats) {
    pcStack_10 = cmd;
    cmd_get_arg_choice((command *)cmd,"choice",&local_14);
    buy_stat(local_14,stats,points_spent,points_inc,&points_left,true);
  }
  return;
}

Assistant:

void do_cmd_buy_stat(struct command *cmd)
{
	/* .choice is the stat to sell */
	if (!rolled_stats) {
		int choice;
		cmd_get_arg_choice(cmd, "choice", &choice);
		buy_stat(choice, stats, points_spent, points_inc,
			&points_left, true);
	}
}